

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmInstruction * UnderlyingValue(VmInstruction *inst)

{
  VmValue *pVVar1;
  ulong uVar2;
  ulong uVar3;
  VmInstruction *pVVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  VmInstruction *pVVar8;
  
LAB_001b6d39:
  do {
    pVVar4 = inst;
    if (pVVar4->cmd != VM_INST_MOV) {
      if ((pVVar4->cmd == VM_INST_DEF) &&
         (uVar2 = (ulong)(pVVar4->super_VmValue).users.count, uVar2 != 0)) {
        uVar3 = 0;
        do {
          pVVar1 = (pVVar4->super_VmValue).users.data[uVar3];
          if ((((pVVar1 != (VmValue *)0x0) && (pVVar1->typeID == 2)) &&
              (*(int *)&pVVar1[1]._vptr_VmValue == 0x51)) &&
             (uVar5 = (ulong)pVVar1[1].type.type, uVar5 != 0)) {
            uVar6 = 1;
            do {
              pVVar8 = *(VmInstruction **)(*(long *)&pVVar1[1].typeID + -8 + uVar6 * 8);
              if ((pVVar8 == (VmInstruction *)0x0) || ((pVVar8->super_VmValue).typeID != 2)) {
                pVVar8 = (VmInstruction *)0x0;
              }
              if (uVar5 <= uVar6) goto LAB_001b6e55;
              inst = *(VmInstruction **)(*(long *)&pVVar1[1].typeID + uVar6 * 8);
              if ((inst == (VmInstruction *)0x0) || ((inst->super_VmValue).typeID != 2)) {
                if (pVVar8 != (VmInstruction *)0x0) {
                  __assert_fail("source",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                                ,0x1d18,"VmInstruction *UnderlyingValue(VmInstruction *)");
                }
LAB_001b6e36:
                __assert_fail("destination",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,0x1d17,"VmInstruction *UnderlyingValue(VmInstruction *)");
              }
              if (pVVar8 == (VmInstruction *)0x0) goto LAB_001b6e36;
              if (pVVar8 == pVVar4) goto LAB_001b6d39;
              uVar7 = uVar6 + 1;
              uVar6 = uVar6 + 2;
            } while (uVar7 < uVar5);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != uVar2);
      }
      return pVVar4;
    }
    if ((pVVar4->arguments).count == 0) {
LAB_001b6e55:
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x199,
                    "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]");
    }
    inst = (VmInstruction *)*(pVVar4->arguments).data;
    if ((inst == (VmInstruction *)0x0) || ((inst->super_VmValue).typeID != 2)) {
      __assert_fail("argument",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x1d05,"VmInstruction *UnderlyingValue(VmInstruction *)");
    }
  } while( true );
}

Assistant:

VmInstruction* UnderlyingValue(VmInstruction *inst)
{
	if(inst->cmd == VM_INST_MOV)
	{
		VmInstruction *argument = getType<VmInstruction>(inst->arguments[0]);

		assert(argument);

		return UnderlyingValue(argument);
	}

	if(inst->cmd == VM_INST_DEF)
	{
		for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

			if(instruction && instruction->cmd == VM_INST_PARALLEL_COPY)
			{
				for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
				{
					VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
					VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

					assert(destination);
					assert(source);

					if(inst == destination)
						return UnderlyingValue(source);
				}
			}
		}
	}

	return inst;
}